

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCallMethodExp *expression)

{
  string *psVar1;
  IExpression *pIVar2;
  CExpList *pCVar3;
  __uniq_ptr_data<IExpression,_std::default_delete<IExpression>,_true,_true> _Var4;
  bool bVar5;
  __uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
  this_00;
  ISubtreeWrapper *_wrapper;
  CCallExpression *this_01;
  CNameExpression *this_02;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  CBuildVisitor *this_03;
  pointer puVar8;
  IVisitor local_e0;
  _Head_base<0UL,_IRT::ISubtreeWrapper_*,_false> local_d8;
  _Head_base<0UL,_const_IRT::CNameExpression_*,_false> local_d0;
  _Alloc_hider local_c8;
  __uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> local_c0;
  shared_ptr<ClassInfo> classInfo;
  string mineMethodObjectClassName;
  shared_ptr<TypeInfo> returnTypeInfo;
  mapped_type methodInfo;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CCallMethod\n");
  pIVar2 = (expression->objectExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&mineMethodObjectClassName);
  psVar1 = &this->currentObjectClassName;
  std::__cxx11::string::string((string *)&mineMethodObjectClassName,(string *)psVar1);
  bVar5 = std::operator!=(&mineMethodObjectClassName,"");
  if (bVar5) {
    this_00.super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
    _M_t.super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
         (__uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>)
         operator_new(0x20);
    IRT::CExpressionList::CExpressionList
              ((CExpressionList *)
               this_00.
               super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
               ._M_t.
               super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
               .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl,(CExpression *)0x0
              );
    pCVar3 = (expression->args)._M_t.super___uniq_ptr_impl<CExpList,_std::default_delete<CExpList>_>
             ._M_t.super__Tuple_impl<0UL,_CExpList_*,_std::default_delete<CExpList>_>.
             super__Head_base<0UL,_CExpList_*,_false>._M_head_impl;
    this_03 = (CBuildVisitor *)&local_c8;
    local_c8._M_p = mineMethodObjectClassName._M_dataplus._M_p;
    IRT::CExpressionList::Add
              ((CExpressionList *)
               this_00.
               super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
               ._M_t.
               super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
               .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               this_03);
    local_c0._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
         (tuple<IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>)
         (tuple<IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>)psVar1;
    if ((_func_int **)local_c8._M_p != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_c8._M_p + 0x10))();
    }
    local_c8._M_p = (pointer)0x0;
    for (puVar8 = *(pointer *)
                   &(pCVar3->exps).
                    super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                    ._M_impl;
        puVar8 != (pCVar3->exps).
                  super__Vector_base<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
      _Var4.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
      super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
      super__Head_base<0UL,_IExpression_*,_false>._M_head_impl =
           (puVar8->_M_t).super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>;
      (*(code *)**(undefined8 **)
                  _Var4.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)
                (_Var4.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                 super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                 super__Head_base<0UL,_IExpression_*,_false>._M_head_impl,this);
      (**((this->wrapper)._M_t.
          super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
          _M_t.
          super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
          .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper
      )(&classInfo);
      local_e0._vptr_IVisitor =
           (_func_int **)classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_03 = (CBuildVisitor *)&local_e0;
      IRT::CExpressionList::Add
                ((CExpressionList *)
                 this_00.
                 super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                 .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_e0);
      if ((element_type *)local_e0._vptr_IVisitor != (element_type *)0x0) {
        (**(code **)(*local_e0._vptr_IVisitor + 0x10))();
      }
      local_e0._vptr_IVisitor = (_func_int **)0x0;
      if (classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (**(code **)(((classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     name)._M_dataplus._M_p + 0x10))();
      }
    }
    _wrapper = (ISubtreeWrapper *)operator_new(0x10);
    this_01 = (CCallExpression *)operator_new(0x18);
    this_02 = (CNameExpression *)operator_new(0x28);
    GetMethodFullName(&local_50,this_03,&mineMethodObjectClassName,
                      &((expression->methodName)._M_t.
                        super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                        super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                        super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name);
    IRT::CLabel::CLabel((CLabel *)&classInfo,&local_50);
    IRT::CNameExpression::CNameExpression(this_02,(CLabel *)&classInfo);
    local_d8._M_head_impl =
         (ISubtreeWrapper *)
         this_00.
         super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>.
         _M_t.
         super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
         super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    local_d0._M_head_impl = this_02;
    IRT::CCallExpression::CCallExpression
              (this_01,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                        *)&local_d0,
               (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                *)&local_d8);
    _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b478;
    _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)this_01;
    updateSubtreeWrapper(this,_wrapper);
    if ((_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)local_d8._M_head_impl !=
        (_Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>)0x0) {
      (*(((IExpression *)&(local_d8._M_head_impl)->_vptr_ISubtreeWrapper)->super_INode)._vptr_INode
        [2])();
    }
    local_d8._M_head_impl = (ISubtreeWrapper *)0x0;
    if (local_d0._M_head_impl != (CNameExpression *)0x0) {
      (*((local_d0._M_head_impl)->super_CExpression).super_IExpression.super_INode._vptr_INode[2])()
      ;
    }
    local_d0._M_head_impl = (CNameExpression *)0x0;
    std::__cxx11::string::~string((string *)&classInfo);
    std::__cxx11::string::~string((string *)&local_50);
    p_Var6 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)this->symbolTable,&mineMethodObjectClassName)->
              super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
    p_Var7 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->methods,
                           &((expression->methodName)._M_t.
                             super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
                             super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
                             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl)->name)->
              super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,p_Var7);
    std::__shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&returnTypeInfo.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>,
               &((methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                returnType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>);
    if ((returnTypeInfo.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        isPrimitive == true) {
      std::__cxx11::string::assign
                ((char *)local_c0._M_t.
                         super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                         .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl);
    }
    else {
      std::__cxx11::string::_M_assign
                ((string *)
                 local_c0._M_t.
                 super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                 .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&returnTypeInfo.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&classInfo.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&mineMethodObjectClassName);
    return;
  }
  __assert_fail("mineMethodObjectClassName != \"\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                ,0x98,"virtual void CBuildVisitor::Visit(CCallMethodExp &)");
}

Assistant:

void CBuildVisitor::Visit( CCallMethodExp &expression ) {

    std::cout << "IRT builder: CCallMethod\n";

    expression.objectExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> objectExpression = std::move( wrapper->ToExpression( ));
    std::string mineMethodObjectClassName = currentObjectClassName;
    assert( mineMethodObjectClassName != "" );

    IRT::CExpressionList *expressionListIrt = new IRT::CExpressionList( );
    std::vector<std::unique_ptr<IExpression> > &arguments = expression.args->exps;
    expressionListIrt->Add( std::move( objectExpression ));
    for ( auto it = arguments.begin( ); it != arguments.end( ); ++it ) {
        ( *it )->Accept( *this );
        expressionListIrt->Add( std::move( wrapper->ToExpression( )));
    }

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CCallExpression(
                    std::unique_ptr<const IRT::CNameExpression>( new IRT::CNameExpression(
                            IRT::CLabel( GetMethodFullName( mineMethodObjectClassName, expression.methodName->name ))
                    )),
                    std::unique_ptr<const IRT::CExpressionList>( expressionListIrt ))
    ));

    std::shared_ptr<ClassInfo> classInfo = symbolTable->classes.at( mineMethodObjectClassName );
    auto methodInfo = classInfo->methods[ expression.methodName->name ];
    auto returnTypeInfo = methodInfo->returnType;
    if ( returnTypeInfo->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = returnTypeInfo->className;
    }
}